

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::getDualsSingletonRow(HPresolve *this,int row,int col)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer piVar10;
  _Elt_pointer pdVar11;
  ulong uVar12;
  pointer pdVar13;
  ostream *poVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  _Elt_pointer ppVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  pair<int,_std::vector<double,_std::allocator<double>_>_> bnd;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_88;
  vector<double,_std::allocator<double>_> local_48;
  
  ppVar22 = (this->super_HPreData).oldBounds.c.
            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar22 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).oldBounds.c.
               super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar22 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).oldBounds.c.
                        super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_48,&ppVar22[-1].second);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&(this->super_HPreData).oldBounds.c);
  uVar20 = (ulong)row;
  pdVar13 = (this->super_HPreData).valueRowDual.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->super_HPreData).valueRowDual.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar20) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
  }
  pdVar13[uVar20] = 0.0;
  pdVar11 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar11 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    pdVar11 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).postValue.c.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  dVar2 = pdVar11[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&(this->super_HPreData).postValue.c);
  dVar28 = HPreData::getaij(&this->super_HPreData,row,col);
  uVar27 = (ulong)col;
  pdVar13 = (this->super_HPreData).valuePrimal.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar16 = uVar27;
  if ((ulong)((long)(this->super_HPreData).valuePrimal.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar27)
  goto LAB_00148f85;
  dVar31 = *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar30 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  dVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[2];
  dVar4 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[3];
  dVar33 = pdVar13[uVar27];
  dVar32 = this->tol;
  if ((dVar32 < dVar28 * dVar33 - dVar3) && (dVar32 < dVar4 - dVar28 * dVar33)) {
    pdVar13 = (this->super_HPreData).valueRowDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    dVar33 = 0.0;
    uVar16 = uVar20;
    if (uVar20 < (ulong)((long)(this->super_HPreData).valueRowDual.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar13 >> 3)) {
LAB_001489e8:
      pdVar13[uVar20] = dVar33;
LAB_001489ee:
      piVar10 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_start;
      uVar16 = uVar20;
      if ((ulong)((long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2) <= uVar20)
      goto LAB_00148f85;
      piVar10[uVar20] = 1;
      piVar10 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar16 = uVar27;
      if ((ulong)((long)(this->super_HPreData).nonbasicFlag.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar10 >> 2) <= uVar27)
      goto LAB_00148f85;
      if (piVar10[uVar27] != 0) {
        if (piVar10[uVar27] != 1) goto LAB_00148a9e;
        pdVar13 = (this->super_HPreData).valuePrimal.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).valuePrimal.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar27)
        goto LAB_00148f85;
        dVar2 = pdVar13[uVar27];
        if ((dVar2 != dVar31) || (NAN(dVar2) || NAN(dVar31))) {
          if ((dVar2 != dVar30) || (NAN(dVar2) || NAN(dVar30))) {
            piVar10[uVar27] = 0;
            piVar10[(long)row + (long)(this->super_HPreData).numColOriginal] = 1;
            goto LAB_00148a9e;
          }
        }
      }
      piVar10[(long)row + (long)(this->super_HPreData).numColOriginal] = 0;
LAB_00148a9e:
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
    goto LAB_00148f85;
  }
  if ((dVar33 <= dVar31) || (dVar30 <= dVar33)) {
LAB_00148642:
    if ((dVar33 == dVar31) && (dVar33 < dVar30)) {
      pdVar13 = (this->super_HPreData).valueColDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if ((ulong)((long)(this->super_HPreData).valueColDual.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar27)
      goto LAB_00148f85;
      pdVar1 = pdVar13 + uVar27;
      if (*pdVar1 <= -dVar32 && -dVar32 != *pdVar1) goto LAB_001486ba;
    }
    if ((dVar33 != dVar30) || (dVar33 <= dVar31)) goto LAB_001486e0;
    pdVar13 = (this->super_HPreData).valueColDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if ((ulong)((long)(this->super_HPreData).valueColDual.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar27)
    goto LAB_00148f85;
    if (pdVar13[uVar27] <= dVar32) goto LAB_001486e0;
  }
  else {
    pdVar13 = (this->super_HPreData).valueColDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if ((ulong)((long)(this->super_HPreData).valueColDual.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar27)
    goto LAB_00148f85;
    if (ABS(pdVar13[uVar27]) <= dVar32) goto LAB_00148642;
  }
LAB_001486ba:
  pdVar13 = (this->super_HPreData).valueColDual.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->super_HPreData).valueColDual.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar27) {
LAB_00148f85:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16);
  }
  pdVar13[uVar27] = 0.0;
LAB_001486e0:
  piVar10 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar16 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
  uVar18 = uVar27;
  if (uVar27 < uVar16) {
    piVar8 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
    uVar16 = uVar17;
    if (uVar27 < uVar17) {
      iVar7 = piVar10[uVar27];
      uVar12 = (ulong)iVar7;
      iVar26 = piVar8[uVar27];
      piVar10 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar15 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
      piVar8 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar23 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
      pdVar13 = (this->super_HPreData).valueRowDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar24 = (long)(this->super_HPreData).valueRowDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
      pdVar9 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar25 = (long)(this->super_HPreData).Avalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
      uVar19 = uVar12;
      if (uVar12 < uVar15) {
        uVar19 = uVar15;
      }
      if (iVar26 < iVar7) {
        iVar26 = iVar7;
      }
      dVar32 = 0.0;
      do {
        if ((long)iVar26 == uVar12) {
          piVar10 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->super_HPreData).flagRow.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar10 >> 2) <= uVar20) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar20);
          }
          piVar10[uVar20] = 1;
          pdVar13 = (this->super_HPreData).valueColDual.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar16 = uVar27;
          if (uVar27 < (ulong)((long)(this->super_HPreData).valueColDual.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar13 >> 3)) {
            dVar33 = ((pdVar13[uVar27] - dVar2) - dVar32) / dVar28;
            if ((dVar33 == 0.0) && (!NAN(dVar33))) goto LAB_001489ee;
            if (this->iKKTcheck == 1) {
              KktChStep::addCost(&(this->super_HPreData).chk,col,dVar2);
            }
            if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
              pdVar13 = (this->super_HPreData).valuePrimal.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->super_HPreData).valuePrimal.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3) <= uVar27)
              goto LAB_00148fcc;
              dVar5 = pdVar13[uVar27];
              dVar29 = dVar28 * dVar5;
              dVar6 = this->tol;
              if ((((dVar29 == dVar3) && (!NAN(dVar29) && !NAN(dVar3))) && (dVar6 < dVar33)) ||
                 (((dVar29 == dVar4 && (!NAN(dVar29) && !NAN(dVar4))) && (dVar33 < -dVar6)))) {
                local_a0 = 0.0;
                local_b0 = 0.0;
                local_a8 = 1e+200;
                if (dVar33 <= dVar6) {
                  local_a0 = 1e+200;
                }
                local_88 = (double)(-(ulong)(dVar6 < dVar33) & 0xe974e718d7d7625a);
                if ((dVar5 != dVar31) || (dVar30 <= dVar31)) {
                  local_b0 = -1e+200;
                  if ((dVar5 != dVar30) || (dVar30 <= dVar31)) {
                    if ((dVar31 == dVar30) && (!NAN(dVar31) && !NAN(dVar30))) {
                      local_a8 = 0.0;
                      local_b0 = 0.0;
                    }
                  }
                  else {
                    local_a8 = 0.0;
                  }
                }
                if (dVar28 <= 0.0) {
                  if (dVar28 < 0.0) {
                    if ((-1e+200 < local_88) &&
                       (dVar31 = dVar28 * local_88 + dVar2 + dVar32, dVar31 < local_a8)) {
                      local_a8 = dVar31;
                    }
                    if ((dVar6 < dVar33) &&
                       (dVar31 = dVar28 * local_a0 + dVar2 + dVar32, local_b0 < dVar31)) {
                      local_b0 = dVar31;
                    }
                  }
                }
                else {
                  if ((-1e+200 < local_88) &&
                     (dVar31 = dVar28 * local_88 + dVar2 + dVar32, local_b0 < dVar31)) {
                    local_b0 = dVar31;
                  }
                  if ((dVar6 < dVar33) &&
                     (dVar31 = dVar28 * local_a0 + dVar2 + dVar32, dVar31 < local_a8)) {
                    local_a8 = dVar31;
                  }
                }
                if (dVar28 <= 0.0) {
                  if (dVar28 < 0.0) {
                    if ((-1e+200 < local_b0) &&
                       (dVar31 = ((local_b0 - dVar32) - dVar2) / dVar28, dVar31 < local_a0)) {
                      local_a0 = dVar31;
                    }
                    if ((local_a8 < 1e+200) &&
                       (dVar31 = ((local_b0 - dVar32) - dVar2) / dVar28, local_88 < dVar31)) {
                      local_88 = dVar31;
                    }
                  }
                }
                else {
                  if ((-1e+200 < local_b0) &&
                     (dVar31 = ((local_b0 - dVar32) - dVar2) / dVar28, local_88 < dVar31)) {
                    local_88 = dVar31;
                  }
                  if ((local_a8 < 1e+200) &&
                     (dVar31 = ((local_a8 - dVar32) - dVar2) / dVar28, dVar31 < local_a0)) {
                    local_a0 = dVar31;
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"loY= ",5);
                poVar14 = std::ostream::_M_insert<double>(local_88);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," upY= ",6);
                poVar14 = std::ostream::_M_insert<double>(local_a0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"loZ= ",5);
                poVar14 = std::ostream::_M_insert<double>(local_b0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," upZ= ",6);
                poVar14 = std::ostream::_M_insert<double>(local_a8);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                std::ostream::flush();
                pdVar13 = (this->super_HPreData).valueRowDual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar16 = (long)(this->super_HPreData).valueRowDual.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
                if (uVar16 <= uVar20) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar20,uVar16);
                }
                pdVar13[uVar20] = 0.0;
                piVar10 = (this->super_HPreData).Astart.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar18 = (long)(this->super_HPreData).Astart.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
                uVar17 = uVar27;
                if (uVar18 <= uVar27) goto LAB_00148f71;
                piVar8 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                uVar19 = (long)(this->super_HPreData).Aend.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
                uVar18 = uVar19;
                if (uVar19 <= uVar27) goto LAB_00148f71;
                iVar7 = piVar10[uVar27];
                uVar15 = (ulong)iVar7;
                iVar26 = piVar8[uVar27];
                piVar10 = (this->super_HPreData).Aindex.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar23 = (long)(this->super_HPreData).Aindex.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
                piVar8 = (this->super_HPreData).flagRow.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar24 = (long)(this->super_HPreData).flagRow.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
                pdVar9 = (this->super_HPreData).Avalue.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar25 = (long)(this->super_HPreData).Avalue.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
                uVar12 = uVar15;
                if (uVar15 < uVar23) {
                  uVar12 = uVar23;
                }
                if (iVar26 < iVar7) {
                  iVar26 = iVar7;
                }
                dVar31 = 0.0;
                goto LAB_00148df3;
              }
            }
            pdVar13 = (this->super_HPreData).valueRowDual.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar16 = uVar20;
            if (uVar20 < (ulong)((long)(this->super_HPreData).valueRowDual.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar13 >> 3))
            goto LAB_001489e8;
          }
LAB_00148fcc:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar16);
        }
        uVar16 = uVar15;
        uVar18 = uVar19;
        if ((uVar15 <= uVar12) ||
           (uVar21 = (ulong)piVar10[uVar12], uVar16 = uVar23, uVar18 = uVar21, uVar23 <= uVar21))
        break;
        if (piVar8[uVar21] != 0) {
          uVar16 = uVar24;
          if ((uVar24 <= uVar21) || (uVar16 = uVar25, uVar18 = uVar12, uVar25 <= uVar12)) break;
          dVar32 = dVar32 + pdVar13[uVar21] * pdVar9[uVar12];
        }
        uVar12 = uVar12 + 1;
        uVar16 = uVar17;
        uVar18 = uVar27;
      } while (uVar27 < uVar17);
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar18,
             uVar16);
  while (uVar15 = uVar15 + 1, uVar18 = uVar19, uVar17 = uVar27, uVar27 < uVar19) {
LAB_00148df3:
    if ((long)iVar26 == uVar15) {
      pdVar9 = (this->super_HPreData).valueColDual.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (uVar27 < (ulong)((long)(this->super_HPreData).valueColDual.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar9 >> 3)) {
        dVar30 = dVar2 + dVar31;
        if (((pdVar9[uVar27] <= 0.0) || (0.0 <= dVar30)) &&
           ((0.0 <= pdVar9[uVar27] || (dVar30 <= 0.0)))) {
          pdVar9[uVar27] = dVar30;
          goto LAB_00148a9e;
        }
        pdVar13[uVar20] = (-dVar2 - dVar31) / dVar28;
        pdVar9[uVar27] = 0.0;
        if (this->iKKTcheck != 1) goto LAB_00148a9e;
        pdVar13 = (this->super_HPreData).valuePrimal.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (uVar27 < (ulong)((long)(this->super_HPreData).valuePrimal.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar13 >> 3)) {
          KktChStep::addChange(&(this->super_HPreData).chk,2,0,col,pdVar13[uVar27],0.0,dVar2);
          goto LAB_00148a9e;
        }
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar27)
      ;
    }
    uVar18 = uVar23;
    uVar17 = uVar12;
    if ((uVar23 <= uVar15) ||
       (uVar21 = (ulong)piVar10[uVar15], uVar18 = uVar24, uVar17 = uVar21, uVar24 <= uVar21)) break;
    if (piVar8[uVar21] != 0) {
      uVar18 = uVar16;
      if ((uVar16 <= uVar21) || (uVar18 = uVar25, uVar17 = uVar15, uVar25 <= uVar15)) break;
      dVar31 = dVar31 + pdVar13[uVar21] * pdVar9[uVar15];
    }
  }
LAB_00148f71:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17,
             uVar18);
}

Assistant:

void HPresolve::getDualsSingletonRow( int row, int col ) {

	pair< int ,vector<double> > bnd = oldBounds.top(); oldBounds.pop();

	valueRowDual.at(row) = 0;
	double cost = postValue.top(); postValue.pop();
	double aij = getaij(row, col);
	double l = (get<1>(bnd))[0];
	double u = (get<1>(bnd))[1];
	double lrow = (get<1>(bnd))[2];
	double urow = (get<1>(bnd))[3];
	if ((aij*valuePrimal.at(col) - lrow) > tol && ( -aij*valuePrimal.at(col) + urow) > tol) {
		valueRowDual.at(row) = 0;
		//row is nonbasic

	}
	else {
		if  ((valuePrimal.at(col) > l && valuePrimal.at(col) < u && abs(valueColDual.at(col)) > tol ) ||
				(valuePrimal.at(col) == l && valuePrimal.at(col) < u && valueColDual.at(col) < -tol ) ||
				(valuePrimal.at(col) == u && valuePrimal.at(col) > l && valueColDual.at(col) > tol )) {

			valueColDual.at(col) = 0;
		}

		double sum = 0;
		for (int k=Astart.at(col); k<Aend.at(col);++k )
			if (flagRow.at(Aindex.at(k)))
				sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);

		flagRow.at(row) = 1;


		double y = (valueColDual.at(col) - cost - sum)/aij;
		if (y != 0) {
			if (iKKTcheck == 1)
				chk.addCost(col, cost);

			//aij * yi + sum + ci = zi
			if (urow != lrow)
				if  ((aij*valuePrimal.at(col) == lrow && y >  tol) ||
					(aij*valuePrimal.at(col) == urow && y < -tol)) {


					//bounds on y_row
					double loY = -HSOL_CONST_INF;
					double upY = HSOL_CONST_INF;

					if (y>tol)
						upY = 0;
					else //y < -tol
						loY = 0;

					//bounds on z_col
					double loZ = -HSOL_CONST_INF;
					double upZ = HSOL_CONST_INF;
					if  (valuePrimal.at(col) == l && l < u ) {
						loZ = 0;
					}
					else if (valuePrimal.at(col) == u && l < u) {
						upZ = 0;
					}
					else if (l==u) {
						loZ = 0;
						upZ = 0;
					}
					//aij * yi + sum + ci = zi

					double lo = -HSOL_CONST_INF;
					double up = HSOL_CONST_INF;
					//bounds on z by y
					if (aij > 0) {
						if (loY >  -HSOL_CONST_INF) {
							lo = sum + cost + aij * loY;
							if (lo>loZ)
								loZ = lo;
						}
						if (upY < HSOL_CONST_INF) {
							up = sum + cost + aij * upY;
							if (up<upZ)
								upZ = up;
						}
					}
					else if (aij < 0) {
						if (loY >  -HSOL_CONST_INF) {
							up = sum + cost + aij * loY;
							if (up<upZ)
								upZ = up;
						}
						if (upY < HSOL_CONST_INF) {
							lo = sum + cost + aij * upY;
							if (lo>loZ)
								loZ = lo;
						}
					}
					//bounds on y by z
					//aij * yi  = zi - sum - ci
					if (aij > 0) {
						if (loZ >  -HSOL_CONST_INF) {
							lo = (loZ - sum - cost )/aij;
							if (lo>loY)
								loY = lo;
						}
						if (upZ < HSOL_CONST_INF) {
							up = (upZ - sum - cost )/aij;
							if (up<upY)
								upY = up;
						}
					}
					else if (aij < 0) {
						if (loZ >  -HSOL_CONST_INF) {
							up = (loZ - sum - cost )/aij;
							if (up<upY)
								upY = up;
						}
						if (upZ < HSOL_CONST_INF) {
							lo = (loZ - sum - cost )/aij;
							if (lo>loY)
								loY = lo;
						}
					}

					cout<< "loY= "<< loY <<" upY= "<<upY<<"loZ= "<< loZ <<" upZ= "<<upZ<<endl;

					valueRowDual.at(row) = 0;

					sum = 0;
					for (int k=Astart.at(col); k<Aend.at(col);++k )
						if (flagRow.at(Aindex.at(k))) {
							sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);
							//cout<<" row "<<Aindex.at(k)<<" dual "<<valueRowDual.at(Aindex.at(k))<<" a_"<<Aindex.at(k)<<"_"<<j<<"\n";
						}
					double newz = cost + sum;
					if ((valueColDual.at(col) > 0 && newz < 0) ||
						(valueColDual.at(col) < 0 && newz > 0)) {
						//valueColDual.at(col) = 0;
						//update valueRowDual.at(row)
						//newz = 0 if cost + sum + aijyi = 0 so aijyi = - cost - sum

						valueRowDual.at(row) = (-cost - sum)/aij;
						valueColDual.at(col) = 0;
						if (iKKTcheck == 1) {
							chk.addChange(2, 0, col, valuePrimal.at(col), valueColDual.at(col), cost);
						}
						return;

					}

					valueColDual.at(col) = newz;
					return;
				}
		valueRowDual.at(row) = y;
		}
	}

	flagRow.at(row) = 1;
	//row is introduced so something needs to become basic :



	//check if x is at a bound forced by the singleton row: then x becomes basic and row nonbasic
	if (nonbasicFlag.at(col) == 1) {
		// x was not basic but is now
		if (valuePrimal.at(col)  != l && valuePrimal.at(col) != u ) {
			nonbasicFlag.at(col) = 0;
			nonbasicFlag[numColOriginal + row] = 1;
		}
		// x was not basic and is not now either, row is basic
		else
			nonbasicFlag[numColOriginal + row] = 0;
	}
	else if (nonbasicFlag.at(col) == 0)  // x is basic
		nonbasicFlag[numColOriginal + row] = 0; //row becomes basic too

}